

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O1

void frssort1(string *strings,size_t scnt)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  list_conflict plVar5;
  list_conflict __ptr;
  group_conflict g;
  group pgVar6;
  list plVar7;
  long *plVar8;
  size_t sVar9;
  group pgVar10;
  int pos;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  list_conflict plVar14;
  uint p;
  bucket_conflict *b;
  long *plVar15;
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar11 = 0;
    plVar5 = __ptr;
    do {
      plVar5->str = strings[uVar11];
      plVar14 = (list_conflict)0x0;
      if (uVar11 < scnt - 1) {
        plVar14 = plVar5 + 1;
      }
      plVar5->next = plVar14;
      uVar11 = uVar11 + 1;
      plVar5 = plVar5 + 1;
    } while (scnt != uVar11);
  }
  plVar7 = __ptr;
  if (1 < (int)scnt) {
    initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
    initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
    g = (group_conflict)allocmem(groupmem,0x30);
    pgVar6 = (group)allocmem(groupmem,0x30);
    g->nextunf = pgVar6;
    g->next = pgVar6;
    pgVar6->head = __ptr;
    pgVar6->finis = 0;
    pgVar6->next = (group)0x0;
    pgVar6->nextunf = (group)0x0;
    b = (bucket_conflict *)0x0;
    intobuckets(g,(bucket_conflict *)0x0,pos);
    pgVar6 = g->nextunf;
    while (pgVar6 != (group)0x0) {
      p = (int)b + 1;
      b = (bucket_conflict *)(ulong)p;
      lVar12 = 0;
      do {
        plVar15 = (long *)(&forward1_b)[lVar12];
        if (plVar15 != (long *)0x0) {
          do {
            uVar13 = (uint)(lVar12 == 0);
            if (((lVar12 != 0) && ((int)plVar15[2] < 0x14)) && (uVar13 = 1, 1 < (int)plVar15[2])) {
              plVar7 = ListInsertsort((list)*plVar15,(list_conflict *)(plVar15 + 1),p);
              *plVar15 = (long)plVar7;
            }
            plVar1 = (long *)plVar15[3];
            lVar2 = *plVar15;
            lVar3 = plVar15[1];
            if (*plVar1 == 0) {
              *plVar1 = lVar2;
              plVar1[1] = lVar3;
              *(uint *)(plVar1 + 5) = uVar13;
              plVar1[4] = (long)plVar1;
            }
            else if ((uVar13 == 0) || (lVar4 = plVar1[4], *(int *)(lVar4 + 0x28) == 0)) {
              plVar8 = (long *)allocmem(groupmem,0x30);
              *plVar8 = lVar2;
              plVar8[1] = lVar3;
              lVar2 = plVar1[4];
              plVar8[2] = *(long *)(lVar2 + 0x10);
              plVar8[3] = *(long *)(lVar2 + 0x18);
              *(uint *)(plVar8 + 5) = uVar13;
              *(long **)(lVar2 + 0x10) = plVar8;
              *(long **)(lVar2 + 0x18) = plVar8;
              plVar1[4] = (long)plVar8;
            }
            else {
              *(long *)(*(long *)(lVar4 + 8) + 8) = lVar2;
              *(long *)(lVar4 + 8) = lVar3;
            }
            plVar15 = (long *)plVar15[4];
          } while (plVar15 != (long *)0x0);
          (&forward1_b)[lVar12] = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x100);
      intobuckets(g,b,0x100);
      pgVar6 = g->nextunf;
    }
    pgVar6 = g->next;
    plVar7 = pgVar6->head;
    for (pgVar10 = pgVar6->next; pgVar10 != (group)0x0; pgVar10 = pgVar10->next) {
      pgVar6->tail->next = pgVar10->head;
      pgVar6 = pgVar10;
    }
    freemem(bucketmem);
    freemem(groupmem);
  }
  if (scnt != 0) {
    sVar9 = 0;
    do {
      strings[sVar9] = plVar7->str;
      sVar9 = sVar9 + 1;
      plVar7 = plVar7->next;
    } while (scnt != sVar9);
  }
  free(__ptr);
  return;
}

Assistant:

void frssort1(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward1(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}